

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

void __thiscall
kj::Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>::eraseImpl
          (Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *this,
          size_t pos)

{
  StringPtr *pSVar1;
  StringPtr *pSVar2;
  size_t sVar3;
  RemoveConst<kj::StringPtr> *pRVar4;
  StringPtr *in_R8;
  StringPtr *in_R9;
  HashIndex<kj::_::(anonymous_namespace)::StringHasher> *indexObj;
  ArrayPtr<kj::StringPtr> table;
  ArrayPtr<kj::StringPtr> table_00;
  
  pSVar1 = (this->rows).builder.ptr;
  table.size_ = (size_t)pSVar1[pos].content.ptr;
  table.ptr = (StringPtr *)pos;
  HashIndex<kj::_::(anonymous_namespace)::StringHasher>::erase<kj::StringPtr,kj::StringPtr>
            (&this->indexes,table,pSVar1[pos].content.size_,in_R8);
  pSVar1 = (this->rows).builder.ptr;
  pRVar4 = (this->rows).builder.pos;
  table_00.ptr = (StringPtr *)(((long)pRVar4 - (long)pSVar1 >> 4) - 1);
  if (table_00.ptr != (StringPtr *)pos) {
    table_00.size_ = pos;
    HashIndex<kj::_::(anonymous_namespace)::StringHasher>::move<kj::StringPtr,kj::StringPtr>
              (&this->indexes,table_00,(size_t)pSVar1[(long)table_00.ptr].content.ptr,
               pSVar1[(long)table_00.ptr].content.size_,in_R9);
    pSVar2 = (this->rows).builder.ptr;
    pSVar1 = pSVar2 + (long)table_00.ptr;
    sVar3 = (pSVar1->content).size_;
    pSVar2 = pSVar2 + pos;
    (pSVar2->content).ptr = (pSVar1->content).ptr;
    (pSVar2->content).size_ = sVar3;
    pRVar4 = (this->rows).builder.pos;
  }
  (this->rows).builder.pos = pRVar4 + -1;
  return;
}

Assistant:

void Table<Row, Indexes...>::eraseImpl(size_t pos) {
  Impl<>::erase(*this, pos, rows[pos]);
  size_t back = rows.size() - 1;
  if (pos != back) {
    Impl<>::move(*this, back, pos, rows[back]);
    rows[pos] = kj::mv(rows[back]);
  }
  rows.removeLast();
}